

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockStrictOrderTest.cpp
# Opt level: O3

void __thiscall
TEST_MockStrictOrderTest_OrderObserved_Test::~TEST_MockStrictOrderTest_OrderObserved_Test
          (TEST_MockStrictOrderTest_OrderObserved_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockStrictOrderTest, OrderObserved)
{
    mock().strictOrder();

    mock().expectOneCall("foo1");
    mock().expectOneCall("foo2");
    mock().actualCall("foo1");
    mock().actualCall("foo2");

    mock().checkExpectations();
}